

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seismogram.cpp
# Opt level: O3

void __thiscall
CombinedSeismogramm<float,_3>::Save
          (CombinedSeismogramm<float,_3> *this,SeismoType type,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *paths)

{
  pointer pbVar1;
  pointer pSVar2;
  float *pfVar3;
  pointer pfVar4;
  pointer pcVar5;
  long *plVar6;
  undefined8 uVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  pointer pbVar9;
  pointer pvVar10;
  ostream *poVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  char *pcVar15;
  long lVar16;
  int iVar17;
  ulong uVar18;
  ofstream outf;
  ofstream outf_res;
  ofstream outf_expl;
  ulong local_690;
  long *local_688 [2];
  long local_678 [2];
  undefined8 local_668;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_660;
  ios_base *local_658;
  long local_650;
  ios_base *local_648;
  ios_base *local_640;
  long local_638;
  undefined1 local_630 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_620 [14];
  ios_base aiStack_538 [264];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_430;
  filebuf local_428 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_420 [14];
  ios_base aiStack_338 [264];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_230;
  filebuf local_228 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220 [14];
  ios_base aiStack_138 [264];
  
  if (type == CSV) {
    if ((ulong)(((long)(this->seismogramms).
                       super__Vector_base<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->seismogramms).
                       super__Vector_base<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 6) * 0x4924924924924925) <
        (ulong)(((long)(paths->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(paths->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start >> 5) * 3)) {
      pcVar15 = "Too many Csv files to save!";
LAB_0010b1b4:
      poVar11 = std::operator<<((ostream *)&std::cout,pcVar15);
      std::endl<char,std::char_traits<char>>(poVar11);
      exit(1);
    }
    pfVar3 = (this->times).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    pfVar4 = (this->times).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish;
    interpolate_data_on_equal_time_intervals
              (this,((pfVar4[-1] - *pfVar3) / (float)(((long)pfVar4 - (long)pfVar3 >> 2) - 1)) *
                    this->interpolation_multiplier);
    pbVar9 = (paths->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((paths->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish != pbVar9) {
      local_660 = _VTT;
      local_668 = __filebuf;
      local_640 = aiStack_138;
      local_648 = aiStack_338;
      local_658 = aiStack_538;
      local_690 = 0;
      do {
        pcVar5 = pbVar9[local_690]._M_dataplus._M_p;
        local_430 = local_420;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_430,pcVar5,pcVar5 + pbVar9[local_690]._M_string_length);
        std::__cxx11::string::append((char *)&local_430);
        std::ofstream::ofstream(local_630,local_430->_M_local_buf,_S_out);
        local_650 = local_690 * 0x20;
        if (local_430 != local_420) {
          operator_delete(local_430,local_420[0]._M_allocated_capacity + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_630,"Time;",5);
        uVar18 = 0;
        while (pSVar2 = (this->seismogramms).
                        super__Vector_base<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
              uVar12 = ((long)*(pointer *)
                               ((long)&(pSVar2->data).
                                       super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                       ._M_impl + 8) -
                        *(long *)&(pSVar2->data).
                                  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                  ._M_impl >> 3) * -0x5555555555555555,
              uVar18 <= uVar12 && uVar12 - uVar18 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_630,"Vx (edge = ",0xb)
          ;
          uVar18 = uVar18 + 1;
          iVar17 = (int)uVar18;
          poVar11 = (ostream *)std::ostream::operator<<((ostream *)local_630,iVar17);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,");",2);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_630,"Vy (edge = ",0xb)
          ;
          poVar11 = (ostream *)std::ostream::operator<<((ostream *)local_630,iVar17);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,");",2);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_630,"Vz (edge = ",0xb)
          ;
          poVar11 = (ostream *)std::ostream::operator<<((ostream *)local_630,iVar17);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,");",2);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_630,"\n",1);
        uVar14 = (int)local_690 * 3;
        plVar6 = *(long **)&(this->seismogramms).
                            super__Vector_base<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar14].data.
                            super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                            ._M_impl;
        if (plVar6[1] != *plVar6) {
          local_638 = (ulong)(uVar14 + 1) * 0x1c0;
          uVar18 = 0;
          do {
            poVar11 = std::ostream::_M_insert<double>
                                ((double)(this->times).
                                         super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                         super__Vector_impl_data._M_start[uVar18]);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,";",1);
            pSVar2 = (this->seismogramms).
                     super__Vector_base<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            pvVar10 = *(pointer *)
                       &pSVar2[uVar14].data.
                        super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                        ._M_impl;
            if (*(pointer *)
                 ((long)&pSVar2[uVar14].data.
                         super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                         ._M_impl + 8) != pvVar10) {
              lVar16 = 0;
              uVar12 = 0;
              do {
                poVar11 = std::ostream::_M_insert<double>
                                    ((double)*(float *)(*(long *)((long)&(pvVar10->
                                                                                                                                                  
                                                  super__Vector_base<float,_std::allocator<float>_>)
                                                  ._M_impl.super__Vector_impl_data + lVar16) +
                                                  uVar18 * 4));
                std::__ostream_insert<char,std::char_traits<char>>(poVar11,";",1);
                poVar11 = std::ostream::_M_insert<double>
                                    ((double)*(float *)(*(long *)(*(long *)((long)(((this->
                                                  seismogramms).
                                                  super__Vector_base<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  header_data).other +
                                                  local_638 + 0xffffffffffffffceU) + lVar16) +
                                                  uVar18 * 4));
                std::__ostream_insert<char,std::char_traits<char>>(poVar11,";",1);
                poVar11 = std::ostream::_M_insert<double>
                                    ((double)*(float *)(*(long *)(*(long *)&(this->seismogramms).
                                                                                                                                                        
                                                  super__Vector_base<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [uVar14 + 2].data.
                                                  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                                  ._M_impl + lVar16) + uVar18 * 4));
                std::__ostream_insert<char,std::char_traits<char>>(poVar11,";",1);
                uVar12 = uVar12 + 1;
                pSVar2 = (this->seismogramms).
                         super__Vector_base<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                pvVar10 = *(pointer *)
                           &pSVar2[uVar14].data.
                            super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                            ._M_impl;
                uVar13 = ((long)*(pointer *)
                                 ((long)&pSVar2[uVar14].data.
                                         super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                         ._M_impl + 8) - (long)pvVar10 >> 3) * -0x5555555555555555;
                lVar16 = lVar16 + 0x18;
              } while (uVar12 <= uVar13 && uVar13 - uVar12 != 0);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_630,"\n",1);
            uVar18 = uVar18 + 1;
            plVar6 = *(long **)&(this->seismogramms).
                                super__Vector_base<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar14].data.
                                super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                ._M_impl;
          } while (uVar18 < (ulong)(plVar6[1] - *plVar6 >> 2));
        }
        std::ofstream::close();
        pbVar9 = (paths->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_230 = local_220;
        lVar16 = *(long *)((long)&(pbVar9->_M_dataplus)._M_p + local_650);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_230,lVar16,
                   *(long *)((long)&pbVar9->_M_string_length + local_650) + lVar16);
        std::__cxx11::string::append((char *)&local_230);
        std::ofstream::ofstream(&local_430,local_230->_M_local_buf,_S_out);
        if (local_230 != local_220) {
          operator_delete(local_230,local_220[0]._M_allocated_capacity + 1);
        }
        pSVar2 = (this->seismogramms).
                 super__Vector_base<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if (*(pointer *)
             ((long)&pSVar2[uVar14].trace_header_data.
                     super__Vector_base<segy_trace_header,_std::allocator<segy_trace_header>_>.
                     _M_impl + 8) !=
            *(pointer *)
             &pSVar2[uVar14].trace_header_data.
              super__Vector_base<segy_trace_header,_std::allocator<segy_trace_header>_>._M_impl) {
          uVar18 = 0;
          do {
            poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)&local_430);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
            poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
            uVar18 = uVar18 + 1;
            pSVar2 = (this->seismogramms).
                     super__Vector_base<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            uVar12 = ((long)*(pointer *)
                             ((long)&pSVar2[uVar14].trace_header_data.
                                     super__Vector_base<segy_trace_header,_std::allocator<segy_trace_header>_>
                                     ._M_impl + 8) -
                      *(long *)&pSVar2[uVar14].trace_header_data.
                                super__Vector_base<segy_trace_header,_std::allocator<segy_trace_header>_>
                                ._M_impl >> 4) * -0x1111111111111111;
          } while (uVar18 <= uVar12 && uVar12 - uVar18 != 0);
        }
        std::ofstream::close();
        pbVar9 = (paths->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_688[0] = local_678;
        lVar16 = *(long *)((long)&(pbVar9->_M_dataplus)._M_p + local_650);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_688,lVar16,
                   *(long *)((long)&pbVar9->_M_string_length + local_650) + lVar16);
        std::__cxx11::string::append((char *)local_688);
        std::ofstream::ofstream(&local_230,(char *)local_688[0],_S_out);
        if (local_688[0] != local_678) {
          operator_delete(local_688[0],local_678[0] + 1);
        }
        poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
        poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
        std::ofstream::close();
        paVar8 = local_660;
        uVar7 = local_668;
        local_230 = local_660;
        *(undefined8 *)(local_228 + *(long *)(local_660->_M_local_buf + -0x18) + -8) = local_668;
        std::filebuf::~filebuf(local_228);
        std::ios_base::~ios_base(local_640);
        local_430 = paVar8;
        *(undefined8 *)(local_428 + *(long *)(paVar8->_M_local_buf + -0x18) + -8) = uVar7;
        std::filebuf::~filebuf(local_428);
        std::ios_base::~ios_base(local_648);
        local_630._0_8_ = paVar8;
        *(undefined8 *)(local_630 + *(long *)(paVar8->_M_local_buf + -0x18)) = uVar7;
        std::filebuf::~filebuf((filebuf *)(local_630 + 8));
        std::ios_base::~ios_base(local_658);
        local_690 = (ulong)((int)local_690 + 1);
        pbVar9 = (paths->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      } while (local_690 <
               (ulong)((long)(paths->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar9 >> 5));
    }
  }
  else if (type == SEG_Y) {
    pbVar9 = (paths->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (paths->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)(((long)(this->seismogramms).
                       super__Vector_base<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->seismogramms).
                       super__Vector_base<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 6) * 0x6db6db6db6db6db7) <
        (ulong)((long)pbVar1 - (long)pbVar9 >> 5)) {
      pcVar15 = "Too many Seg-Y files to save!";
      goto LAB_0010b1b4;
    }
    if (pbVar1 != pbVar9) {
      uVar14 = 1;
      uVar18 = 0;
      do {
        pSVar2 = (this->seismogramms).
                 super__Vector_base<Seismogramm<float>,_std::allocator<Seismogramm<float>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_630,pbVar9[uVar18]._M_dataplus._M_p,(allocator<char> *)&local_430
                  );
        Seismogramm<float>::SaveSegY(pSVar2 + uVar18,(string *)local_630,&this->times,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_630._0_8_ != local_620) {
          operator_delete((void *)local_630._0_8_,local_620[0]._M_allocated_capacity + 1);
        }
        uVar18 = (ulong)uVar14;
        pbVar9 = (paths->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar14 = uVar14 + 1;
      } while (uVar18 < (ulong)((long)(paths->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar9 >>
                               5));
    }
  }
  return;
}

Assistant:

void CombinedSeismogramm<Scalar, dims>::Save(SeismoType type, std::vector<std::string> paths)
{
    if (type == SEG_Y)
    {
        if (paths.size()> seismogramms.size())
        {
            std::cout << "Too many Seg-Y files to save!" << std::endl;
            std::exit(1);
        }
        for (IndexType i = 0; i < paths.size(); ++i)
        {
            seismogramms[i].SaveSegY(paths[i].data(), times);
        }
    }
    else if (type == CSV)
    {
        if (paths.size() * dims > 3 * seismogramms.size())
        {
            std::cout << "Too many Csv files to save!" << std::endl;
            std::exit(1);
        }

        Scalar interval = (times.back() - times.front()) / (times.size() - 1);
        interpolate_data_on_equal_time_intervals(interval * interpolation_multiplier);
        interval = times[1] - times[0];

        for (IndexType path_index = 0; path_index < paths.size(); path_index++)
        {
            // Saving data
            std::ofstream outf ((paths[path_index] + ".csv").c_str(), std::ios::out);
            outf << "Time;";
            for (int i = 0; i < seismogramms[0].data.size(); i++)
            {
                outf << "Vx (edge = " << i + 1 << ");";
                outf << "Vy (edge = " << i + 1 << ");";
                if (dims >= 3)
                    outf << "Vz (edge = " << i + 1 << ");";
            }
            outf << "\n";
            for (int i = 0; i < seismogramms[dims*path_index].data[0].size(); i++)
            {
                outf << times[i] << ";";
                for (int j = 0; j < seismogramms[dims*path_index].data.size(); j++)
                {
                    outf << seismogramms[dims*path_index + 0].data[j][i] << ";";
                    outf << seismogramms[dims*path_index + 1].data[j][i] << ";";
                    if (dims >= 3)
                        outf << seismogramms[dims*path_index + 2].data[j][i] << ";";
                }
                outf << "\n";
            }
            outf.close();
            // Saving receivers
            std::ofstream outf_res ((paths[path_index] + ".rec.txt").c_str(), std::ios::out);
            for (int i = 0; i < seismogramms[dims*path_index].trace_header_data.size(); i++)
            {
                outf_res << seismogramms[dims*path_index].trace_header_data[i].receiver_x << " " <<
                            seismogramms[dims*path_index].trace_header_data[i].receiver_y << "\n";
            }
            outf_res.close();
            // Saving explosion coords
            std::ofstream outf_expl ((paths[path_index] + ".expl.txt").c_str(), std::ios::out);
            outf_expl << seismogramms[dims*path_index].trace_header_data[0].source_x << " " <<
                         seismogramms[dims*path_index].trace_header_data[0].source_y << "\n";
            outf_expl.close();
        }
    }
}